

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512vnni_gemm.h
# Opt level: O2

void intgemm::AVX512VNNI::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
               (int8_t *A,int8_t *B,Index A_rows,Index width,Index B_cols,
               UnquantizeAndAddBiasAndWriteRelu callback)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  char cVar11;
  int8_t *piVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  Index A_rowidx;
  ulong uVar16;
  uint uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
  callback_impl;
  OutputBufferInfo local_f0;
  int8_t *local_e0;
  ulong local_d8;
  int8_t *local_d0;
  ulong local_c8;
  vector_t<CPUType::AVX2,_int> local_c0;
  CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu> local_a0;
  
  local_a0.config.output_addr = callback.output_addr;
  local_a0.config._0_8_ = callback._0_8_;
  local_a0.config.bias_addr = callback.bias_addr;
  local_a0.unquant_mult[1] = callback.unquant_mult;
  local_a0.unquant_mult[0] = callback.unquant_mult;
  local_a0.unquant_mult[2] = callback.unquant_mult;
  local_a0.unquant_mult[3] = callback.unquant_mult;
  local_a0.unquant_mult[4] = callback.unquant_mult;
  local_a0.unquant_mult[5] = callback.unquant_mult;
  local_a0.unquant_mult[6] = callback.unquant_mult;
  local_a0.unquant_mult[7] = callback.unquant_mult;
  local_c8 = (ulong)A_rows;
  uVar13 = 0;
  local_e0 = B;
  local_d0 = A;
  for (uVar17 = 0; piVar12 = local_e0, uVar17 < B_cols; uVar17 = uVar17 + 8) {
    uVar15 = 0;
    local_d8 = uVar13;
    for (uVar16 = 0; uVar16 != local_c8; uVar16 = uVar16 + 1) {
      auVar30 = ZEXT1664((undefined1  [16])0x0);
      uVar14 = 0;
      auVar31 = ZEXT1664((undefined1  [16])0x0);
      auVar32 = ZEXT1664((undefined1  [16])0x0);
      auVar33 = ZEXT1664((undefined1  [16])0x0);
      auVar34 = ZEXT1664((undefined1  [16])0x0);
      auVar35 = ZEXT1664((undefined1  [16])0x0);
      auVar36 = ZEXT1664((undefined1  [16])0x0);
      auVar37 = ZEXT1664((undefined1  [16])0x0);
      in_ZMM18 = vpternlogd_avx512f(in_ZMM18,in_ZMM18,in_ZMM18,0xff);
      in_ZMM19 = vpxord_avx512f(in_ZMM19,in_ZMM19);
      for (; (width & 0xffffffc0) != uVar14; uVar14 = uVar14 + 0x40) {
        auVar19 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_d0 + uVar14 + uVar15));
        auVar20 = vmovdqa64_avx512f(*(undefined1 (*) [64])(piVar12 + uVar14 * 8 + uVar13 * 0x40));
        auVar21 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                     (piVar12 + uVar14 * 8 + uVar13 * 0x40 + 0x40));
        auVar22 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                     (piVar12 + uVar14 * 8 + uVar13 * 0x40 + 0x80));
        auVar23 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                     (piVar12 + uVar14 * 8 + uVar13 * 0x40 + 0xc0));
        auVar24 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                     (piVar12 + uVar14 * 8 + uVar13 * 0x40 + 0x100));
        auVar25 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                     (piVar12 + uVar14 * 8 + uVar13 * 0x40 + 0x140));
        auVar26 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                     (piVar12 + uVar14 * 8 + uVar13 * 0x40 + 0x180));
        auVar27 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                     (piVar12 + uVar14 * 8 + uVar13 * 0x40 + 0x1c0));
        uVar10 = vpcmpgtb_avx512bw(auVar19,in_ZMM18);
        auVar19 = vpabsb_avx512bw(auVar19);
        auVar28 = vpsubb_avx512bw(in_ZMM19,auVar20);
        auVar20 = vmovdqu8_avx512bw(auVar20);
        bVar1 = (byte)uVar10;
        auVar29[0] = (bVar1 & 1) * auVar20[0] | !(bool)(bVar1 & 1) * auVar28[0];
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar29[1] = bVar2 * auVar20[1] | !bVar2 * auVar28[1];
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar29[2] = bVar2 * auVar20[2] | !bVar2 * auVar28[2];
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar29[3] = bVar2 * auVar20[3] | !bVar2 * auVar28[3];
        bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
        auVar29[4] = bVar2 * auVar20[4] | !bVar2 * auVar28[4];
        bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
        auVar29[5] = bVar2 * auVar20[5] | !bVar2 * auVar28[5];
        bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
        auVar29[6] = bVar2 * auVar20[6] | !bVar2 * auVar28[6];
        bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
        auVar29[7] = bVar2 * auVar20[7] | !bVar2 * auVar28[7];
        bVar3 = (byte)(uVar10 >> 8);
        auVar29[8] = (bVar3 & 1) * auVar20[8] | !(bool)(bVar3 & 1) * auVar28[8];
        bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
        auVar29[9] = bVar2 * auVar20[9] | !bVar2 * auVar28[9];
        bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
        auVar29[10] = bVar2 * auVar20[10] | !bVar2 * auVar28[10];
        bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
        auVar29[0xb] = bVar2 * auVar20[0xb] | !bVar2 * auVar28[0xb];
        bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
        auVar29[0xc] = bVar2 * auVar20[0xc] | !bVar2 * auVar28[0xc];
        bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
        auVar29[0xd] = bVar2 * auVar20[0xd] | !bVar2 * auVar28[0xd];
        bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
        auVar29[0xe] = bVar2 * auVar20[0xe] | !bVar2 * auVar28[0xe];
        bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
        auVar29[0xf] = bVar2 * auVar20[0xf] | !bVar2 * auVar28[0xf];
        bVar4 = (byte)(uVar10 >> 0x10);
        auVar29[0x10] = (bVar4 & 1) * auVar20[0x10] | !(bool)(bVar4 & 1) * auVar28[0x10];
        bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
        auVar29[0x11] = bVar2 * auVar20[0x11] | !bVar2 * auVar28[0x11];
        bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
        auVar29[0x12] = bVar2 * auVar20[0x12] | !bVar2 * auVar28[0x12];
        bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
        auVar29[0x13] = bVar2 * auVar20[0x13] | !bVar2 * auVar28[0x13];
        bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
        auVar29[0x14] = bVar2 * auVar20[0x14] | !bVar2 * auVar28[0x14];
        bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
        auVar29[0x15] = bVar2 * auVar20[0x15] | !bVar2 * auVar28[0x15];
        bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
        auVar29[0x16] = bVar2 * auVar20[0x16] | !bVar2 * auVar28[0x16];
        bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
        auVar29[0x17] = bVar2 * auVar20[0x17] | !bVar2 * auVar28[0x17];
        bVar5 = (byte)(uVar10 >> 0x18);
        auVar29[0x18] = (bVar5 & 1) * auVar20[0x18] | !(bool)(bVar5 & 1) * auVar28[0x18];
        bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
        auVar29[0x19] = bVar2 * auVar20[0x19] | !bVar2 * auVar28[0x19];
        bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
        auVar29[0x1a] = bVar2 * auVar20[0x1a] | !bVar2 * auVar28[0x1a];
        bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
        auVar29[0x1b] = bVar2 * auVar20[0x1b] | !bVar2 * auVar28[0x1b];
        bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
        auVar29[0x1c] = bVar2 * auVar20[0x1c] | !bVar2 * auVar28[0x1c];
        bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
        auVar29[0x1d] = bVar2 * auVar20[0x1d] | !bVar2 * auVar28[0x1d];
        bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
        auVar29[0x1e] = bVar2 * auVar20[0x1e] | !bVar2 * auVar28[0x1e];
        bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
        auVar29[0x1f] = bVar2 * auVar20[0x1f] | !bVar2 * auVar28[0x1f];
        bVar6 = (byte)(uVar10 >> 0x20);
        auVar29[0x20] = (bVar6 & 1) * auVar20[0x20] | !(bool)(bVar6 & 1) * auVar28[0x20];
        bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
        auVar29[0x21] = bVar2 * auVar20[0x21] | !bVar2 * auVar28[0x21];
        bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
        auVar29[0x22] = bVar2 * auVar20[0x22] | !bVar2 * auVar28[0x22];
        bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
        auVar29[0x23] = bVar2 * auVar20[0x23] | !bVar2 * auVar28[0x23];
        bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
        auVar29[0x24] = bVar2 * auVar20[0x24] | !bVar2 * auVar28[0x24];
        bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
        auVar29[0x25] = bVar2 * auVar20[0x25] | !bVar2 * auVar28[0x25];
        bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
        auVar29[0x26] = bVar2 * auVar20[0x26] | !bVar2 * auVar28[0x26];
        bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
        auVar29[0x27] = bVar2 * auVar20[0x27] | !bVar2 * auVar28[0x27];
        bVar7 = (byte)(uVar10 >> 0x28);
        auVar29[0x28] = (bVar7 & 1) * auVar20[0x28] | !(bool)(bVar7 & 1) * auVar28[0x28];
        bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
        auVar29[0x29] = bVar2 * auVar20[0x29] | !bVar2 * auVar28[0x29];
        bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
        auVar29[0x2a] = bVar2 * auVar20[0x2a] | !bVar2 * auVar28[0x2a];
        bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
        auVar29[0x2b] = bVar2 * auVar20[0x2b] | !bVar2 * auVar28[0x2b];
        bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
        auVar29[0x2c] = bVar2 * auVar20[0x2c] | !bVar2 * auVar28[0x2c];
        bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
        auVar29[0x2d] = bVar2 * auVar20[0x2d] | !bVar2 * auVar28[0x2d];
        bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
        auVar29[0x2e] = bVar2 * auVar20[0x2e] | !bVar2 * auVar28[0x2e];
        bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
        auVar29[0x2f] = bVar2 * auVar20[0x2f] | !bVar2 * auVar28[0x2f];
        bVar8 = (byte)(uVar10 >> 0x30);
        auVar29[0x30] = (bVar8 & 1) * auVar20[0x30] | !(bool)(bVar8 & 1) * auVar28[0x30];
        bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
        auVar29[0x31] = bVar2 * auVar20[0x31] | !bVar2 * auVar28[0x31];
        bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
        auVar29[0x32] = bVar2 * auVar20[0x32] | !bVar2 * auVar28[0x32];
        bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
        auVar29[0x33] = bVar2 * auVar20[0x33] | !bVar2 * auVar28[0x33];
        bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
        auVar29[0x34] = bVar2 * auVar20[0x34] | !bVar2 * auVar28[0x34];
        bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
        auVar29[0x35] = bVar2 * auVar20[0x35] | !bVar2 * auVar28[0x35];
        bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
        auVar29[0x36] = bVar2 * auVar20[0x36] | !bVar2 * auVar28[0x36];
        bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
        auVar29[0x37] = bVar2 * auVar20[0x37] | !bVar2 * auVar28[0x37];
        bVar9 = (byte)(uVar10 >> 0x38);
        auVar29[0x38] = (bVar9 & 1) * auVar20[0x38] | !(bool)(bVar9 & 1) * auVar28[0x38];
        bVar2 = (bool)(bVar9 >> 1 & 1);
        auVar29[0x39] = bVar2 * auVar20[0x39] | !bVar2 * auVar28[0x39];
        bVar2 = (bool)(bVar9 >> 2 & 1);
        auVar29[0x3a] = bVar2 * auVar20[0x3a] | !bVar2 * auVar28[0x3a];
        bVar2 = (bool)(bVar9 >> 3 & 1);
        auVar29[0x3b] = bVar2 * auVar20[0x3b] | !bVar2 * auVar28[0x3b];
        bVar2 = (bool)(bVar9 >> 4 & 1);
        auVar29[0x3c] = bVar2 * auVar20[0x3c] | !bVar2 * auVar28[0x3c];
        bVar2 = (bool)(bVar9 >> 5 & 1);
        auVar29[0x3d] = bVar2 * auVar20[0x3d] | !bVar2 * auVar28[0x3d];
        bVar2 = (bool)(bVar9 >> 6 & 1);
        auVar29[0x3e] = bVar2 * auVar20[0x3e] | !bVar2 * auVar28[0x3e];
        cVar11 = (char)bVar9 >> 7;
        auVar29[0x3f] = -cVar11 * auVar20[0x3f] | !(bool)-cVar11 * auVar28[0x3f];
        auVar20 = vpsubb_avx512bw(in_ZMM19,auVar21);
        auVar21 = vmovdqu8_avx512bw(auVar21);
        auVar28[0] = (bVar1 & 1) * auVar21[0] | !(bool)(bVar1 & 1) * auVar20[0];
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar28[1] = bVar2 * auVar21[1] | !bVar2 * auVar20[1];
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar28[2] = bVar2 * auVar21[2] | !bVar2 * auVar20[2];
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar28[3] = bVar2 * auVar21[3] | !bVar2 * auVar20[3];
        bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
        auVar28[4] = bVar2 * auVar21[4] | !bVar2 * auVar20[4];
        bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
        auVar28[5] = bVar2 * auVar21[5] | !bVar2 * auVar20[5];
        bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
        auVar28[6] = bVar2 * auVar21[6] | !bVar2 * auVar20[6];
        bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
        auVar28[7] = bVar2 * auVar21[7] | !bVar2 * auVar20[7];
        auVar28[8] = (bVar3 & 1) * auVar21[8] | !(bool)(bVar3 & 1) * auVar20[8];
        bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
        auVar28[9] = bVar2 * auVar21[9] | !bVar2 * auVar20[9];
        bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
        auVar28[10] = bVar2 * auVar21[10] | !bVar2 * auVar20[10];
        bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
        auVar28[0xb] = bVar2 * auVar21[0xb] | !bVar2 * auVar20[0xb];
        bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
        auVar28[0xc] = bVar2 * auVar21[0xc] | !bVar2 * auVar20[0xc];
        bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
        auVar28[0xd] = bVar2 * auVar21[0xd] | !bVar2 * auVar20[0xd];
        bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
        auVar28[0xe] = bVar2 * auVar21[0xe] | !bVar2 * auVar20[0xe];
        bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
        auVar28[0xf] = bVar2 * auVar21[0xf] | !bVar2 * auVar20[0xf];
        auVar28[0x10] = (bVar4 & 1) * auVar21[0x10] | !(bool)(bVar4 & 1) * auVar20[0x10];
        bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
        auVar28[0x11] = bVar2 * auVar21[0x11] | !bVar2 * auVar20[0x11];
        bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
        auVar28[0x12] = bVar2 * auVar21[0x12] | !bVar2 * auVar20[0x12];
        bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
        auVar28[0x13] = bVar2 * auVar21[0x13] | !bVar2 * auVar20[0x13];
        bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
        auVar28[0x14] = bVar2 * auVar21[0x14] | !bVar2 * auVar20[0x14];
        bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
        auVar28[0x15] = bVar2 * auVar21[0x15] | !bVar2 * auVar20[0x15];
        bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
        auVar28[0x16] = bVar2 * auVar21[0x16] | !bVar2 * auVar20[0x16];
        bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
        auVar28[0x17] = bVar2 * auVar21[0x17] | !bVar2 * auVar20[0x17];
        auVar28[0x18] = (bVar5 & 1) * auVar21[0x18] | !(bool)(bVar5 & 1) * auVar20[0x18];
        bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
        auVar28[0x19] = bVar2 * auVar21[0x19] | !bVar2 * auVar20[0x19];
        bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
        auVar28[0x1a] = bVar2 * auVar21[0x1a] | !bVar2 * auVar20[0x1a];
        bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
        auVar28[0x1b] = bVar2 * auVar21[0x1b] | !bVar2 * auVar20[0x1b];
        bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
        auVar28[0x1c] = bVar2 * auVar21[0x1c] | !bVar2 * auVar20[0x1c];
        bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
        auVar28[0x1d] = bVar2 * auVar21[0x1d] | !bVar2 * auVar20[0x1d];
        bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
        auVar28[0x1e] = bVar2 * auVar21[0x1e] | !bVar2 * auVar20[0x1e];
        bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
        auVar28[0x1f] = bVar2 * auVar21[0x1f] | !bVar2 * auVar20[0x1f];
        auVar28[0x20] = (bVar6 & 1) * auVar21[0x20] | !(bool)(bVar6 & 1) * auVar20[0x20];
        bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
        auVar28[0x21] = bVar2 * auVar21[0x21] | !bVar2 * auVar20[0x21];
        bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
        auVar28[0x22] = bVar2 * auVar21[0x22] | !bVar2 * auVar20[0x22];
        bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
        auVar28[0x23] = bVar2 * auVar21[0x23] | !bVar2 * auVar20[0x23];
        bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
        auVar28[0x24] = bVar2 * auVar21[0x24] | !bVar2 * auVar20[0x24];
        bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
        auVar28[0x25] = bVar2 * auVar21[0x25] | !bVar2 * auVar20[0x25];
        bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
        auVar28[0x26] = bVar2 * auVar21[0x26] | !bVar2 * auVar20[0x26];
        bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
        auVar28[0x27] = bVar2 * auVar21[0x27] | !bVar2 * auVar20[0x27];
        auVar28[0x28] = (bVar7 & 1) * auVar21[0x28] | !(bool)(bVar7 & 1) * auVar20[0x28];
        bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
        auVar28[0x29] = bVar2 * auVar21[0x29] | !bVar2 * auVar20[0x29];
        bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
        auVar28[0x2a] = bVar2 * auVar21[0x2a] | !bVar2 * auVar20[0x2a];
        bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
        auVar28[0x2b] = bVar2 * auVar21[0x2b] | !bVar2 * auVar20[0x2b];
        bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
        auVar28[0x2c] = bVar2 * auVar21[0x2c] | !bVar2 * auVar20[0x2c];
        bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
        auVar28[0x2d] = bVar2 * auVar21[0x2d] | !bVar2 * auVar20[0x2d];
        bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
        auVar28[0x2e] = bVar2 * auVar21[0x2e] | !bVar2 * auVar20[0x2e];
        bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
        auVar28[0x2f] = bVar2 * auVar21[0x2f] | !bVar2 * auVar20[0x2f];
        auVar28[0x30] = (bVar8 & 1) * auVar21[0x30] | !(bool)(bVar8 & 1) * auVar20[0x30];
        bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
        auVar28[0x31] = bVar2 * auVar21[0x31] | !bVar2 * auVar20[0x31];
        bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
        auVar28[0x32] = bVar2 * auVar21[0x32] | !bVar2 * auVar20[0x32];
        bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
        auVar28[0x33] = bVar2 * auVar21[0x33] | !bVar2 * auVar20[0x33];
        bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
        auVar28[0x34] = bVar2 * auVar21[0x34] | !bVar2 * auVar20[0x34];
        bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
        auVar28[0x35] = bVar2 * auVar21[0x35] | !bVar2 * auVar20[0x35];
        bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
        auVar28[0x36] = bVar2 * auVar21[0x36] | !bVar2 * auVar20[0x36];
        bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
        auVar28[0x37] = bVar2 * auVar21[0x37] | !bVar2 * auVar20[0x37];
        auVar28[0x38] = (bVar9 & 1) * auVar21[0x38] | !(bool)(bVar9 & 1) * auVar20[0x38];
        bVar2 = (bool)(bVar9 >> 1 & 1);
        auVar28[0x39] = bVar2 * auVar21[0x39] | !bVar2 * auVar20[0x39];
        bVar2 = (bool)(bVar9 >> 2 & 1);
        auVar28[0x3a] = bVar2 * auVar21[0x3a] | !bVar2 * auVar20[0x3a];
        bVar2 = (bool)(bVar9 >> 3 & 1);
        auVar28[0x3b] = bVar2 * auVar21[0x3b] | !bVar2 * auVar20[0x3b];
        bVar2 = (bool)(bVar9 >> 4 & 1);
        auVar28[0x3c] = bVar2 * auVar21[0x3c] | !bVar2 * auVar20[0x3c];
        bVar2 = (bool)(bVar9 >> 5 & 1);
        auVar28[0x3d] = bVar2 * auVar21[0x3d] | !bVar2 * auVar20[0x3d];
        bVar2 = (bool)(bVar9 >> 6 & 1);
        auVar28[0x3e] = bVar2 * auVar21[0x3e] | !bVar2 * auVar20[0x3e];
        auVar28[0x3f] = -cVar11 * auVar21[0x3f] | !(bool)-cVar11 * auVar20[0x3f];
        auVar20 = vpsubb_avx512bw(in_ZMM19,auVar22);
        auVar21 = vmovdqu8_avx512bw(auVar22);
        auVar22[0] = (bVar1 & 1) * auVar21[0] | !(bool)(bVar1 & 1) * auVar20[0];
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar22[1] = bVar2 * auVar21[1] | !bVar2 * auVar20[1];
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar22[2] = bVar2 * auVar21[2] | !bVar2 * auVar20[2];
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar22[3] = bVar2 * auVar21[3] | !bVar2 * auVar20[3];
        bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
        auVar22[4] = bVar2 * auVar21[4] | !bVar2 * auVar20[4];
        bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
        auVar22[5] = bVar2 * auVar21[5] | !bVar2 * auVar20[5];
        bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
        auVar22[6] = bVar2 * auVar21[6] | !bVar2 * auVar20[6];
        bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
        auVar22[7] = bVar2 * auVar21[7] | !bVar2 * auVar20[7];
        auVar22[8] = (bVar3 & 1) * auVar21[8] | !(bool)(bVar3 & 1) * auVar20[8];
        bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
        auVar22[9] = bVar2 * auVar21[9] | !bVar2 * auVar20[9];
        bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
        auVar22[10] = bVar2 * auVar21[10] | !bVar2 * auVar20[10];
        bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
        auVar22[0xb] = bVar2 * auVar21[0xb] | !bVar2 * auVar20[0xb];
        bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
        auVar22[0xc] = bVar2 * auVar21[0xc] | !bVar2 * auVar20[0xc];
        bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
        auVar22[0xd] = bVar2 * auVar21[0xd] | !bVar2 * auVar20[0xd];
        bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
        auVar22[0xe] = bVar2 * auVar21[0xe] | !bVar2 * auVar20[0xe];
        bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
        auVar22[0xf] = bVar2 * auVar21[0xf] | !bVar2 * auVar20[0xf];
        auVar22[0x10] = (bVar4 & 1) * auVar21[0x10] | !(bool)(bVar4 & 1) * auVar20[0x10];
        bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
        auVar22[0x11] = bVar2 * auVar21[0x11] | !bVar2 * auVar20[0x11];
        bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
        auVar22[0x12] = bVar2 * auVar21[0x12] | !bVar2 * auVar20[0x12];
        bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
        auVar22[0x13] = bVar2 * auVar21[0x13] | !bVar2 * auVar20[0x13];
        bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
        auVar22[0x14] = bVar2 * auVar21[0x14] | !bVar2 * auVar20[0x14];
        bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
        auVar22[0x15] = bVar2 * auVar21[0x15] | !bVar2 * auVar20[0x15];
        bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
        auVar22[0x16] = bVar2 * auVar21[0x16] | !bVar2 * auVar20[0x16];
        bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
        auVar22[0x17] = bVar2 * auVar21[0x17] | !bVar2 * auVar20[0x17];
        auVar22[0x18] = (bVar5 & 1) * auVar21[0x18] | !(bool)(bVar5 & 1) * auVar20[0x18];
        bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
        auVar22[0x19] = bVar2 * auVar21[0x19] | !bVar2 * auVar20[0x19];
        bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
        auVar22[0x1a] = bVar2 * auVar21[0x1a] | !bVar2 * auVar20[0x1a];
        bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
        auVar22[0x1b] = bVar2 * auVar21[0x1b] | !bVar2 * auVar20[0x1b];
        bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
        auVar22[0x1c] = bVar2 * auVar21[0x1c] | !bVar2 * auVar20[0x1c];
        bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
        auVar22[0x1d] = bVar2 * auVar21[0x1d] | !bVar2 * auVar20[0x1d];
        bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
        auVar22[0x1e] = bVar2 * auVar21[0x1e] | !bVar2 * auVar20[0x1e];
        bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
        auVar22[0x1f] = bVar2 * auVar21[0x1f] | !bVar2 * auVar20[0x1f];
        auVar22[0x20] = (bVar6 & 1) * auVar21[0x20] | !(bool)(bVar6 & 1) * auVar20[0x20];
        bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
        auVar22[0x21] = bVar2 * auVar21[0x21] | !bVar2 * auVar20[0x21];
        bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
        auVar22[0x22] = bVar2 * auVar21[0x22] | !bVar2 * auVar20[0x22];
        bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
        auVar22[0x23] = bVar2 * auVar21[0x23] | !bVar2 * auVar20[0x23];
        bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
        auVar22[0x24] = bVar2 * auVar21[0x24] | !bVar2 * auVar20[0x24];
        bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
        auVar22[0x25] = bVar2 * auVar21[0x25] | !bVar2 * auVar20[0x25];
        bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
        auVar22[0x26] = bVar2 * auVar21[0x26] | !bVar2 * auVar20[0x26];
        bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
        auVar22[0x27] = bVar2 * auVar21[0x27] | !bVar2 * auVar20[0x27];
        auVar22[0x28] = (bVar7 & 1) * auVar21[0x28] | !(bool)(bVar7 & 1) * auVar20[0x28];
        bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
        auVar22[0x29] = bVar2 * auVar21[0x29] | !bVar2 * auVar20[0x29];
        bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
        auVar22[0x2a] = bVar2 * auVar21[0x2a] | !bVar2 * auVar20[0x2a];
        bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
        auVar22[0x2b] = bVar2 * auVar21[0x2b] | !bVar2 * auVar20[0x2b];
        bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
        auVar22[0x2c] = bVar2 * auVar21[0x2c] | !bVar2 * auVar20[0x2c];
        bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
        auVar22[0x2d] = bVar2 * auVar21[0x2d] | !bVar2 * auVar20[0x2d];
        bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
        auVar22[0x2e] = bVar2 * auVar21[0x2e] | !bVar2 * auVar20[0x2e];
        bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
        auVar22[0x2f] = bVar2 * auVar21[0x2f] | !bVar2 * auVar20[0x2f];
        auVar22[0x30] = (bVar8 & 1) * auVar21[0x30] | !(bool)(bVar8 & 1) * auVar20[0x30];
        bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
        auVar22[0x31] = bVar2 * auVar21[0x31] | !bVar2 * auVar20[0x31];
        bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
        auVar22[0x32] = bVar2 * auVar21[0x32] | !bVar2 * auVar20[0x32];
        bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
        auVar22[0x33] = bVar2 * auVar21[0x33] | !bVar2 * auVar20[0x33];
        bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
        auVar22[0x34] = bVar2 * auVar21[0x34] | !bVar2 * auVar20[0x34];
        bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
        auVar22[0x35] = bVar2 * auVar21[0x35] | !bVar2 * auVar20[0x35];
        bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
        auVar22[0x36] = bVar2 * auVar21[0x36] | !bVar2 * auVar20[0x36];
        bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
        auVar22[0x37] = bVar2 * auVar21[0x37] | !bVar2 * auVar20[0x37];
        auVar22[0x38] = (bVar9 & 1) * auVar21[0x38] | !(bool)(bVar9 & 1) * auVar20[0x38];
        bVar2 = (bool)(bVar9 >> 1 & 1);
        auVar22[0x39] = bVar2 * auVar21[0x39] | !bVar2 * auVar20[0x39];
        bVar2 = (bool)(bVar9 >> 2 & 1);
        auVar22[0x3a] = bVar2 * auVar21[0x3a] | !bVar2 * auVar20[0x3a];
        bVar2 = (bool)(bVar9 >> 3 & 1);
        auVar22[0x3b] = bVar2 * auVar21[0x3b] | !bVar2 * auVar20[0x3b];
        bVar2 = (bool)(bVar9 >> 4 & 1);
        auVar22[0x3c] = bVar2 * auVar21[0x3c] | !bVar2 * auVar20[0x3c];
        bVar2 = (bool)(bVar9 >> 5 & 1);
        auVar22[0x3d] = bVar2 * auVar21[0x3d] | !bVar2 * auVar20[0x3d];
        bVar2 = (bool)(bVar9 >> 6 & 1);
        auVar22[0x3e] = bVar2 * auVar21[0x3e] | !bVar2 * auVar20[0x3e];
        auVar22[0x3f] = -cVar11 * auVar21[0x3f] | !(bool)-cVar11 * auVar20[0x3f];
        auVar20 = vpsubb_avx512bw(in_ZMM19,auVar23);
        auVar21 = vmovdqu8_avx512bw(auVar23);
        auVar23[0] = (bVar1 & 1) * auVar21[0] | !(bool)(bVar1 & 1) * auVar20[0];
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar23[1] = bVar2 * auVar21[1] | !bVar2 * auVar20[1];
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar23[2] = bVar2 * auVar21[2] | !bVar2 * auVar20[2];
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar23[3] = bVar2 * auVar21[3] | !bVar2 * auVar20[3];
        bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
        auVar23[4] = bVar2 * auVar21[4] | !bVar2 * auVar20[4];
        bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
        auVar23[5] = bVar2 * auVar21[5] | !bVar2 * auVar20[5];
        bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
        auVar23[6] = bVar2 * auVar21[6] | !bVar2 * auVar20[6];
        bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
        auVar23[7] = bVar2 * auVar21[7] | !bVar2 * auVar20[7];
        auVar23[8] = (bVar3 & 1) * auVar21[8] | !(bool)(bVar3 & 1) * auVar20[8];
        bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
        auVar23[9] = bVar2 * auVar21[9] | !bVar2 * auVar20[9];
        bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
        auVar23[10] = bVar2 * auVar21[10] | !bVar2 * auVar20[10];
        bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
        auVar23[0xb] = bVar2 * auVar21[0xb] | !bVar2 * auVar20[0xb];
        bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
        auVar23[0xc] = bVar2 * auVar21[0xc] | !bVar2 * auVar20[0xc];
        bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
        auVar23[0xd] = bVar2 * auVar21[0xd] | !bVar2 * auVar20[0xd];
        bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
        auVar23[0xe] = bVar2 * auVar21[0xe] | !bVar2 * auVar20[0xe];
        bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
        auVar23[0xf] = bVar2 * auVar21[0xf] | !bVar2 * auVar20[0xf];
        auVar23[0x10] = (bVar4 & 1) * auVar21[0x10] | !(bool)(bVar4 & 1) * auVar20[0x10];
        bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
        auVar23[0x11] = bVar2 * auVar21[0x11] | !bVar2 * auVar20[0x11];
        bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
        auVar23[0x12] = bVar2 * auVar21[0x12] | !bVar2 * auVar20[0x12];
        bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
        auVar23[0x13] = bVar2 * auVar21[0x13] | !bVar2 * auVar20[0x13];
        bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
        auVar23[0x14] = bVar2 * auVar21[0x14] | !bVar2 * auVar20[0x14];
        bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
        auVar23[0x15] = bVar2 * auVar21[0x15] | !bVar2 * auVar20[0x15];
        bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
        auVar23[0x16] = bVar2 * auVar21[0x16] | !bVar2 * auVar20[0x16];
        bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
        auVar23[0x17] = bVar2 * auVar21[0x17] | !bVar2 * auVar20[0x17];
        auVar23[0x18] = (bVar5 & 1) * auVar21[0x18] | !(bool)(bVar5 & 1) * auVar20[0x18];
        bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
        auVar23[0x19] = bVar2 * auVar21[0x19] | !bVar2 * auVar20[0x19];
        bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
        auVar23[0x1a] = bVar2 * auVar21[0x1a] | !bVar2 * auVar20[0x1a];
        bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
        auVar23[0x1b] = bVar2 * auVar21[0x1b] | !bVar2 * auVar20[0x1b];
        bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
        auVar23[0x1c] = bVar2 * auVar21[0x1c] | !bVar2 * auVar20[0x1c];
        bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
        auVar23[0x1d] = bVar2 * auVar21[0x1d] | !bVar2 * auVar20[0x1d];
        bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
        auVar23[0x1e] = bVar2 * auVar21[0x1e] | !bVar2 * auVar20[0x1e];
        bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
        auVar23[0x1f] = bVar2 * auVar21[0x1f] | !bVar2 * auVar20[0x1f];
        auVar23[0x20] = (bVar6 & 1) * auVar21[0x20] | !(bool)(bVar6 & 1) * auVar20[0x20];
        bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
        auVar23[0x21] = bVar2 * auVar21[0x21] | !bVar2 * auVar20[0x21];
        bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
        auVar23[0x22] = bVar2 * auVar21[0x22] | !bVar2 * auVar20[0x22];
        bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
        auVar23[0x23] = bVar2 * auVar21[0x23] | !bVar2 * auVar20[0x23];
        bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
        auVar23[0x24] = bVar2 * auVar21[0x24] | !bVar2 * auVar20[0x24];
        bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
        auVar23[0x25] = bVar2 * auVar21[0x25] | !bVar2 * auVar20[0x25];
        bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
        auVar23[0x26] = bVar2 * auVar21[0x26] | !bVar2 * auVar20[0x26];
        bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
        auVar23[0x27] = bVar2 * auVar21[0x27] | !bVar2 * auVar20[0x27];
        auVar23[0x28] = (bVar7 & 1) * auVar21[0x28] | !(bool)(bVar7 & 1) * auVar20[0x28];
        bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
        auVar23[0x29] = bVar2 * auVar21[0x29] | !bVar2 * auVar20[0x29];
        bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
        auVar23[0x2a] = bVar2 * auVar21[0x2a] | !bVar2 * auVar20[0x2a];
        bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
        auVar23[0x2b] = bVar2 * auVar21[0x2b] | !bVar2 * auVar20[0x2b];
        bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
        auVar23[0x2c] = bVar2 * auVar21[0x2c] | !bVar2 * auVar20[0x2c];
        bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
        auVar23[0x2d] = bVar2 * auVar21[0x2d] | !bVar2 * auVar20[0x2d];
        bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
        auVar23[0x2e] = bVar2 * auVar21[0x2e] | !bVar2 * auVar20[0x2e];
        bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
        auVar23[0x2f] = bVar2 * auVar21[0x2f] | !bVar2 * auVar20[0x2f];
        auVar23[0x30] = (bVar8 & 1) * auVar21[0x30] | !(bool)(bVar8 & 1) * auVar20[0x30];
        bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
        auVar23[0x31] = bVar2 * auVar21[0x31] | !bVar2 * auVar20[0x31];
        bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
        auVar23[0x32] = bVar2 * auVar21[0x32] | !bVar2 * auVar20[0x32];
        bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
        auVar23[0x33] = bVar2 * auVar21[0x33] | !bVar2 * auVar20[0x33];
        bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
        auVar23[0x34] = bVar2 * auVar21[0x34] | !bVar2 * auVar20[0x34];
        bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
        auVar23[0x35] = bVar2 * auVar21[0x35] | !bVar2 * auVar20[0x35];
        bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
        auVar23[0x36] = bVar2 * auVar21[0x36] | !bVar2 * auVar20[0x36];
        bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
        auVar23[0x37] = bVar2 * auVar21[0x37] | !bVar2 * auVar20[0x37];
        auVar23[0x38] = (bVar9 & 1) * auVar21[0x38] | !(bool)(bVar9 & 1) * auVar20[0x38];
        bVar2 = (bool)(bVar9 >> 1 & 1);
        auVar23[0x39] = bVar2 * auVar21[0x39] | !bVar2 * auVar20[0x39];
        bVar2 = (bool)(bVar9 >> 2 & 1);
        auVar23[0x3a] = bVar2 * auVar21[0x3a] | !bVar2 * auVar20[0x3a];
        bVar2 = (bool)(bVar9 >> 3 & 1);
        auVar23[0x3b] = bVar2 * auVar21[0x3b] | !bVar2 * auVar20[0x3b];
        bVar2 = (bool)(bVar9 >> 4 & 1);
        auVar23[0x3c] = bVar2 * auVar21[0x3c] | !bVar2 * auVar20[0x3c];
        bVar2 = (bool)(bVar9 >> 5 & 1);
        auVar23[0x3d] = bVar2 * auVar21[0x3d] | !bVar2 * auVar20[0x3d];
        bVar2 = (bool)(bVar9 >> 6 & 1);
        auVar23[0x3e] = bVar2 * auVar21[0x3e] | !bVar2 * auVar20[0x3e];
        auVar23[0x3f] = -cVar11 * auVar21[0x3f] | !(bool)-cVar11 * auVar20[0x3f];
        auVar20 = vpsubb_avx512bw(in_ZMM19,auVar24);
        auVar24 = vmovdqu8_avx512bw(auVar24);
        auVar21[0] = (bVar1 & 1) * auVar24[0] | !(bool)(bVar1 & 1) * auVar20[0];
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar21[1] = bVar2 * auVar24[1] | !bVar2 * auVar20[1];
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar21[2] = bVar2 * auVar24[2] | !bVar2 * auVar20[2];
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar21[3] = bVar2 * auVar24[3] | !bVar2 * auVar20[3];
        bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
        auVar21[4] = bVar2 * auVar24[4] | !bVar2 * auVar20[4];
        bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
        auVar21[5] = bVar2 * auVar24[5] | !bVar2 * auVar20[5];
        bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
        auVar21[6] = bVar2 * auVar24[6] | !bVar2 * auVar20[6];
        bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
        auVar21[7] = bVar2 * auVar24[7] | !bVar2 * auVar20[7];
        auVar21[8] = (bVar3 & 1) * auVar24[8] | !(bool)(bVar3 & 1) * auVar20[8];
        bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
        auVar21[9] = bVar2 * auVar24[9] | !bVar2 * auVar20[9];
        bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
        auVar21[10] = bVar2 * auVar24[10] | !bVar2 * auVar20[10];
        bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
        auVar21[0xb] = bVar2 * auVar24[0xb] | !bVar2 * auVar20[0xb];
        bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
        auVar21[0xc] = bVar2 * auVar24[0xc] | !bVar2 * auVar20[0xc];
        bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
        auVar21[0xd] = bVar2 * auVar24[0xd] | !bVar2 * auVar20[0xd];
        bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
        auVar21[0xe] = bVar2 * auVar24[0xe] | !bVar2 * auVar20[0xe];
        bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
        auVar21[0xf] = bVar2 * auVar24[0xf] | !bVar2 * auVar20[0xf];
        auVar21[0x10] = (bVar4 & 1) * auVar24[0x10] | !(bool)(bVar4 & 1) * auVar20[0x10];
        bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
        auVar21[0x11] = bVar2 * auVar24[0x11] | !bVar2 * auVar20[0x11];
        bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
        auVar21[0x12] = bVar2 * auVar24[0x12] | !bVar2 * auVar20[0x12];
        bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
        auVar21[0x13] = bVar2 * auVar24[0x13] | !bVar2 * auVar20[0x13];
        bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
        auVar21[0x14] = bVar2 * auVar24[0x14] | !bVar2 * auVar20[0x14];
        bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
        auVar21[0x15] = bVar2 * auVar24[0x15] | !bVar2 * auVar20[0x15];
        bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
        auVar21[0x16] = bVar2 * auVar24[0x16] | !bVar2 * auVar20[0x16];
        bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
        auVar21[0x17] = bVar2 * auVar24[0x17] | !bVar2 * auVar20[0x17];
        auVar21[0x18] = (bVar5 & 1) * auVar24[0x18] | !(bool)(bVar5 & 1) * auVar20[0x18];
        bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
        auVar21[0x19] = bVar2 * auVar24[0x19] | !bVar2 * auVar20[0x19];
        bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
        auVar21[0x1a] = bVar2 * auVar24[0x1a] | !bVar2 * auVar20[0x1a];
        bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
        auVar21[0x1b] = bVar2 * auVar24[0x1b] | !bVar2 * auVar20[0x1b];
        bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
        auVar21[0x1c] = bVar2 * auVar24[0x1c] | !bVar2 * auVar20[0x1c];
        bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
        auVar21[0x1d] = bVar2 * auVar24[0x1d] | !bVar2 * auVar20[0x1d];
        bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
        auVar21[0x1e] = bVar2 * auVar24[0x1e] | !bVar2 * auVar20[0x1e];
        bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
        auVar21[0x1f] = bVar2 * auVar24[0x1f] | !bVar2 * auVar20[0x1f];
        auVar21[0x20] = (bVar6 & 1) * auVar24[0x20] | !(bool)(bVar6 & 1) * auVar20[0x20];
        bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
        auVar21[0x21] = bVar2 * auVar24[0x21] | !bVar2 * auVar20[0x21];
        bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
        auVar21[0x22] = bVar2 * auVar24[0x22] | !bVar2 * auVar20[0x22];
        bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
        auVar21[0x23] = bVar2 * auVar24[0x23] | !bVar2 * auVar20[0x23];
        bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
        auVar21[0x24] = bVar2 * auVar24[0x24] | !bVar2 * auVar20[0x24];
        bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
        auVar21[0x25] = bVar2 * auVar24[0x25] | !bVar2 * auVar20[0x25];
        bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
        auVar21[0x26] = bVar2 * auVar24[0x26] | !bVar2 * auVar20[0x26];
        bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
        auVar21[0x27] = bVar2 * auVar24[0x27] | !bVar2 * auVar20[0x27];
        auVar21[0x28] = (bVar7 & 1) * auVar24[0x28] | !(bool)(bVar7 & 1) * auVar20[0x28];
        bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
        auVar21[0x29] = bVar2 * auVar24[0x29] | !bVar2 * auVar20[0x29];
        bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
        auVar21[0x2a] = bVar2 * auVar24[0x2a] | !bVar2 * auVar20[0x2a];
        bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
        auVar21[0x2b] = bVar2 * auVar24[0x2b] | !bVar2 * auVar20[0x2b];
        bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
        auVar21[0x2c] = bVar2 * auVar24[0x2c] | !bVar2 * auVar20[0x2c];
        bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
        auVar21[0x2d] = bVar2 * auVar24[0x2d] | !bVar2 * auVar20[0x2d];
        bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
        auVar21[0x2e] = bVar2 * auVar24[0x2e] | !bVar2 * auVar20[0x2e];
        bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
        auVar21[0x2f] = bVar2 * auVar24[0x2f] | !bVar2 * auVar20[0x2f];
        auVar21[0x30] = (bVar8 & 1) * auVar24[0x30] | !(bool)(bVar8 & 1) * auVar20[0x30];
        bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
        auVar21[0x31] = bVar2 * auVar24[0x31] | !bVar2 * auVar20[0x31];
        bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
        auVar21[0x32] = bVar2 * auVar24[0x32] | !bVar2 * auVar20[0x32];
        bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
        auVar21[0x33] = bVar2 * auVar24[0x33] | !bVar2 * auVar20[0x33];
        bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
        auVar21[0x34] = bVar2 * auVar24[0x34] | !bVar2 * auVar20[0x34];
        bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
        auVar21[0x35] = bVar2 * auVar24[0x35] | !bVar2 * auVar20[0x35];
        bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
        auVar21[0x36] = bVar2 * auVar24[0x36] | !bVar2 * auVar20[0x36];
        bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
        auVar21[0x37] = bVar2 * auVar24[0x37] | !bVar2 * auVar20[0x37];
        auVar21[0x38] = (bVar9 & 1) * auVar24[0x38] | !(bool)(bVar9 & 1) * auVar20[0x38];
        bVar2 = (bool)(bVar9 >> 1 & 1);
        auVar21[0x39] = bVar2 * auVar24[0x39] | !bVar2 * auVar20[0x39];
        bVar2 = (bool)(bVar9 >> 2 & 1);
        auVar21[0x3a] = bVar2 * auVar24[0x3a] | !bVar2 * auVar20[0x3a];
        bVar2 = (bool)(bVar9 >> 3 & 1);
        auVar21[0x3b] = bVar2 * auVar24[0x3b] | !bVar2 * auVar20[0x3b];
        bVar2 = (bool)(bVar9 >> 4 & 1);
        auVar21[0x3c] = bVar2 * auVar24[0x3c] | !bVar2 * auVar20[0x3c];
        bVar2 = (bool)(bVar9 >> 5 & 1);
        auVar21[0x3d] = bVar2 * auVar24[0x3d] | !bVar2 * auVar20[0x3d];
        bVar2 = (bool)(bVar9 >> 6 & 1);
        auVar21[0x3e] = bVar2 * auVar24[0x3e] | !bVar2 * auVar20[0x3e];
        auVar21[0x3f] = -cVar11 * auVar24[0x3f] | !(bool)-cVar11 * auVar20[0x3f];
        auVar20 = vpsubb_avx512bw(in_ZMM19,auVar25);
        auVar24 = vmovdqu8_avx512bw(auVar25);
        auVar25[0] = (bVar1 & 1) * auVar24[0] | !(bool)(bVar1 & 1) * auVar20[0];
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar25[1] = bVar2 * auVar24[1] | !bVar2 * auVar20[1];
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar25[2] = bVar2 * auVar24[2] | !bVar2 * auVar20[2];
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar25[3] = bVar2 * auVar24[3] | !bVar2 * auVar20[3];
        bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
        auVar25[4] = bVar2 * auVar24[4] | !bVar2 * auVar20[4];
        bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
        auVar25[5] = bVar2 * auVar24[5] | !bVar2 * auVar20[5];
        bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
        auVar25[6] = bVar2 * auVar24[6] | !bVar2 * auVar20[6];
        bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
        auVar25[7] = bVar2 * auVar24[7] | !bVar2 * auVar20[7];
        auVar25[8] = (bVar3 & 1) * auVar24[8] | !(bool)(bVar3 & 1) * auVar20[8];
        bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
        auVar25[9] = bVar2 * auVar24[9] | !bVar2 * auVar20[9];
        bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
        auVar25[10] = bVar2 * auVar24[10] | !bVar2 * auVar20[10];
        bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
        auVar25[0xb] = bVar2 * auVar24[0xb] | !bVar2 * auVar20[0xb];
        bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
        auVar25[0xc] = bVar2 * auVar24[0xc] | !bVar2 * auVar20[0xc];
        bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
        auVar25[0xd] = bVar2 * auVar24[0xd] | !bVar2 * auVar20[0xd];
        bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
        auVar25[0xe] = bVar2 * auVar24[0xe] | !bVar2 * auVar20[0xe];
        bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
        auVar25[0xf] = bVar2 * auVar24[0xf] | !bVar2 * auVar20[0xf];
        auVar25[0x10] = (bVar4 & 1) * auVar24[0x10] | !(bool)(bVar4 & 1) * auVar20[0x10];
        bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
        auVar25[0x11] = bVar2 * auVar24[0x11] | !bVar2 * auVar20[0x11];
        bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
        auVar25[0x12] = bVar2 * auVar24[0x12] | !bVar2 * auVar20[0x12];
        bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
        auVar25[0x13] = bVar2 * auVar24[0x13] | !bVar2 * auVar20[0x13];
        bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
        auVar25[0x14] = bVar2 * auVar24[0x14] | !bVar2 * auVar20[0x14];
        bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
        auVar25[0x15] = bVar2 * auVar24[0x15] | !bVar2 * auVar20[0x15];
        bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
        auVar25[0x16] = bVar2 * auVar24[0x16] | !bVar2 * auVar20[0x16];
        bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
        auVar25[0x17] = bVar2 * auVar24[0x17] | !bVar2 * auVar20[0x17];
        auVar25[0x18] = (bVar5 & 1) * auVar24[0x18] | !(bool)(bVar5 & 1) * auVar20[0x18];
        bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
        auVar25[0x19] = bVar2 * auVar24[0x19] | !bVar2 * auVar20[0x19];
        bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
        auVar25[0x1a] = bVar2 * auVar24[0x1a] | !bVar2 * auVar20[0x1a];
        bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
        auVar25[0x1b] = bVar2 * auVar24[0x1b] | !bVar2 * auVar20[0x1b];
        bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
        auVar25[0x1c] = bVar2 * auVar24[0x1c] | !bVar2 * auVar20[0x1c];
        bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
        auVar25[0x1d] = bVar2 * auVar24[0x1d] | !bVar2 * auVar20[0x1d];
        bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
        auVar25[0x1e] = bVar2 * auVar24[0x1e] | !bVar2 * auVar20[0x1e];
        bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
        auVar25[0x1f] = bVar2 * auVar24[0x1f] | !bVar2 * auVar20[0x1f];
        auVar25[0x20] = (bVar6 & 1) * auVar24[0x20] | !(bool)(bVar6 & 1) * auVar20[0x20];
        bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
        auVar25[0x21] = bVar2 * auVar24[0x21] | !bVar2 * auVar20[0x21];
        bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
        auVar25[0x22] = bVar2 * auVar24[0x22] | !bVar2 * auVar20[0x22];
        bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
        auVar25[0x23] = bVar2 * auVar24[0x23] | !bVar2 * auVar20[0x23];
        bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
        auVar25[0x24] = bVar2 * auVar24[0x24] | !bVar2 * auVar20[0x24];
        bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
        auVar25[0x25] = bVar2 * auVar24[0x25] | !bVar2 * auVar20[0x25];
        bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
        auVar25[0x26] = bVar2 * auVar24[0x26] | !bVar2 * auVar20[0x26];
        bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
        auVar25[0x27] = bVar2 * auVar24[0x27] | !bVar2 * auVar20[0x27];
        auVar25[0x28] = (bVar7 & 1) * auVar24[0x28] | !(bool)(bVar7 & 1) * auVar20[0x28];
        bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
        auVar25[0x29] = bVar2 * auVar24[0x29] | !bVar2 * auVar20[0x29];
        bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
        auVar25[0x2a] = bVar2 * auVar24[0x2a] | !bVar2 * auVar20[0x2a];
        bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
        auVar25[0x2b] = bVar2 * auVar24[0x2b] | !bVar2 * auVar20[0x2b];
        bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
        auVar25[0x2c] = bVar2 * auVar24[0x2c] | !bVar2 * auVar20[0x2c];
        bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
        auVar25[0x2d] = bVar2 * auVar24[0x2d] | !bVar2 * auVar20[0x2d];
        bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
        auVar25[0x2e] = bVar2 * auVar24[0x2e] | !bVar2 * auVar20[0x2e];
        bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
        auVar25[0x2f] = bVar2 * auVar24[0x2f] | !bVar2 * auVar20[0x2f];
        auVar25[0x30] = (bVar8 & 1) * auVar24[0x30] | !(bool)(bVar8 & 1) * auVar20[0x30];
        bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
        auVar25[0x31] = bVar2 * auVar24[0x31] | !bVar2 * auVar20[0x31];
        bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
        auVar25[0x32] = bVar2 * auVar24[0x32] | !bVar2 * auVar20[0x32];
        bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
        auVar25[0x33] = bVar2 * auVar24[0x33] | !bVar2 * auVar20[0x33];
        bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
        auVar25[0x34] = bVar2 * auVar24[0x34] | !bVar2 * auVar20[0x34];
        bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
        auVar25[0x35] = bVar2 * auVar24[0x35] | !bVar2 * auVar20[0x35];
        bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
        auVar25[0x36] = bVar2 * auVar24[0x36] | !bVar2 * auVar20[0x36];
        bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
        auVar25[0x37] = bVar2 * auVar24[0x37] | !bVar2 * auVar20[0x37];
        auVar25[0x38] = (bVar9 & 1) * auVar24[0x38] | !(bool)(bVar9 & 1) * auVar20[0x38];
        bVar2 = (bool)(bVar9 >> 1 & 1);
        auVar25[0x39] = bVar2 * auVar24[0x39] | !bVar2 * auVar20[0x39];
        bVar2 = (bool)(bVar9 >> 2 & 1);
        auVar25[0x3a] = bVar2 * auVar24[0x3a] | !bVar2 * auVar20[0x3a];
        bVar2 = (bool)(bVar9 >> 3 & 1);
        auVar25[0x3b] = bVar2 * auVar24[0x3b] | !bVar2 * auVar20[0x3b];
        bVar2 = (bool)(bVar9 >> 4 & 1);
        auVar25[0x3c] = bVar2 * auVar24[0x3c] | !bVar2 * auVar20[0x3c];
        bVar2 = (bool)(bVar9 >> 5 & 1);
        auVar25[0x3d] = bVar2 * auVar24[0x3d] | !bVar2 * auVar20[0x3d];
        bVar2 = (bool)(bVar9 >> 6 & 1);
        auVar25[0x3e] = bVar2 * auVar24[0x3e] | !bVar2 * auVar20[0x3e];
        auVar25[0x3f] = -cVar11 * auVar24[0x3f] | !(bool)-cVar11 * auVar20[0x3f];
        auVar20 = vpsubb_avx512bw(in_ZMM19,auVar26);
        auVar24 = vmovdqu8_avx512bw(auVar26);
        auVar26[0] = (bVar1 & 1) * auVar24[0] | !(bool)(bVar1 & 1) * auVar20[0];
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar26[1] = bVar2 * auVar24[1] | !bVar2 * auVar20[1];
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar26[2] = bVar2 * auVar24[2] | !bVar2 * auVar20[2];
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar26[3] = bVar2 * auVar24[3] | !bVar2 * auVar20[3];
        bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
        auVar26[4] = bVar2 * auVar24[4] | !bVar2 * auVar20[4];
        bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
        auVar26[5] = bVar2 * auVar24[5] | !bVar2 * auVar20[5];
        bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
        auVar26[6] = bVar2 * auVar24[6] | !bVar2 * auVar20[6];
        bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
        auVar26[7] = bVar2 * auVar24[7] | !bVar2 * auVar20[7];
        auVar26[8] = (bVar3 & 1) * auVar24[8] | !(bool)(bVar3 & 1) * auVar20[8];
        bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
        auVar26[9] = bVar2 * auVar24[9] | !bVar2 * auVar20[9];
        bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
        auVar26[10] = bVar2 * auVar24[10] | !bVar2 * auVar20[10];
        bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
        auVar26[0xb] = bVar2 * auVar24[0xb] | !bVar2 * auVar20[0xb];
        bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
        auVar26[0xc] = bVar2 * auVar24[0xc] | !bVar2 * auVar20[0xc];
        bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
        auVar26[0xd] = bVar2 * auVar24[0xd] | !bVar2 * auVar20[0xd];
        bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
        auVar26[0xe] = bVar2 * auVar24[0xe] | !bVar2 * auVar20[0xe];
        bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
        auVar26[0xf] = bVar2 * auVar24[0xf] | !bVar2 * auVar20[0xf];
        auVar26[0x10] = (bVar4 & 1) * auVar24[0x10] | !(bool)(bVar4 & 1) * auVar20[0x10];
        bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
        auVar26[0x11] = bVar2 * auVar24[0x11] | !bVar2 * auVar20[0x11];
        bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
        auVar26[0x12] = bVar2 * auVar24[0x12] | !bVar2 * auVar20[0x12];
        bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
        auVar26[0x13] = bVar2 * auVar24[0x13] | !bVar2 * auVar20[0x13];
        bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
        auVar26[0x14] = bVar2 * auVar24[0x14] | !bVar2 * auVar20[0x14];
        bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
        auVar26[0x15] = bVar2 * auVar24[0x15] | !bVar2 * auVar20[0x15];
        bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
        auVar26[0x16] = bVar2 * auVar24[0x16] | !bVar2 * auVar20[0x16];
        bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
        auVar26[0x17] = bVar2 * auVar24[0x17] | !bVar2 * auVar20[0x17];
        auVar26[0x18] = (bVar5 & 1) * auVar24[0x18] | !(bool)(bVar5 & 1) * auVar20[0x18];
        bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
        auVar26[0x19] = bVar2 * auVar24[0x19] | !bVar2 * auVar20[0x19];
        bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
        auVar26[0x1a] = bVar2 * auVar24[0x1a] | !bVar2 * auVar20[0x1a];
        bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
        auVar26[0x1b] = bVar2 * auVar24[0x1b] | !bVar2 * auVar20[0x1b];
        bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
        auVar26[0x1c] = bVar2 * auVar24[0x1c] | !bVar2 * auVar20[0x1c];
        bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
        auVar26[0x1d] = bVar2 * auVar24[0x1d] | !bVar2 * auVar20[0x1d];
        bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
        auVar26[0x1e] = bVar2 * auVar24[0x1e] | !bVar2 * auVar20[0x1e];
        bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
        auVar26[0x1f] = bVar2 * auVar24[0x1f] | !bVar2 * auVar20[0x1f];
        auVar26[0x20] = (bVar6 & 1) * auVar24[0x20] | !(bool)(bVar6 & 1) * auVar20[0x20];
        bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
        auVar26[0x21] = bVar2 * auVar24[0x21] | !bVar2 * auVar20[0x21];
        bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
        auVar26[0x22] = bVar2 * auVar24[0x22] | !bVar2 * auVar20[0x22];
        bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
        auVar26[0x23] = bVar2 * auVar24[0x23] | !bVar2 * auVar20[0x23];
        bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
        auVar26[0x24] = bVar2 * auVar24[0x24] | !bVar2 * auVar20[0x24];
        bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
        auVar26[0x25] = bVar2 * auVar24[0x25] | !bVar2 * auVar20[0x25];
        bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
        auVar26[0x26] = bVar2 * auVar24[0x26] | !bVar2 * auVar20[0x26];
        bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
        auVar26[0x27] = bVar2 * auVar24[0x27] | !bVar2 * auVar20[0x27];
        auVar26[0x28] = (bVar7 & 1) * auVar24[0x28] | !(bool)(bVar7 & 1) * auVar20[0x28];
        bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
        auVar26[0x29] = bVar2 * auVar24[0x29] | !bVar2 * auVar20[0x29];
        bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
        auVar26[0x2a] = bVar2 * auVar24[0x2a] | !bVar2 * auVar20[0x2a];
        bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
        auVar26[0x2b] = bVar2 * auVar24[0x2b] | !bVar2 * auVar20[0x2b];
        bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
        auVar26[0x2c] = bVar2 * auVar24[0x2c] | !bVar2 * auVar20[0x2c];
        bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
        auVar26[0x2d] = bVar2 * auVar24[0x2d] | !bVar2 * auVar20[0x2d];
        bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
        auVar26[0x2e] = bVar2 * auVar24[0x2e] | !bVar2 * auVar20[0x2e];
        bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
        auVar26[0x2f] = bVar2 * auVar24[0x2f] | !bVar2 * auVar20[0x2f];
        auVar26[0x30] = (bVar8 & 1) * auVar24[0x30] | !(bool)(bVar8 & 1) * auVar20[0x30];
        bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
        auVar26[0x31] = bVar2 * auVar24[0x31] | !bVar2 * auVar20[0x31];
        bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
        auVar26[0x32] = bVar2 * auVar24[0x32] | !bVar2 * auVar20[0x32];
        bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
        auVar26[0x33] = bVar2 * auVar24[0x33] | !bVar2 * auVar20[0x33];
        bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
        auVar26[0x34] = bVar2 * auVar24[0x34] | !bVar2 * auVar20[0x34];
        bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
        auVar26[0x35] = bVar2 * auVar24[0x35] | !bVar2 * auVar20[0x35];
        bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
        auVar26[0x36] = bVar2 * auVar24[0x36] | !bVar2 * auVar20[0x36];
        bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
        auVar26[0x37] = bVar2 * auVar24[0x37] | !bVar2 * auVar20[0x37];
        auVar26[0x38] = (bVar9 & 1) * auVar24[0x38] | !(bool)(bVar9 & 1) * auVar20[0x38];
        bVar2 = (bool)(bVar9 >> 1 & 1);
        auVar26[0x39] = bVar2 * auVar24[0x39] | !bVar2 * auVar20[0x39];
        bVar2 = (bool)(bVar9 >> 2 & 1);
        auVar26[0x3a] = bVar2 * auVar24[0x3a] | !bVar2 * auVar20[0x3a];
        bVar2 = (bool)(bVar9 >> 3 & 1);
        auVar26[0x3b] = bVar2 * auVar24[0x3b] | !bVar2 * auVar20[0x3b];
        bVar2 = (bool)(bVar9 >> 4 & 1);
        auVar26[0x3c] = bVar2 * auVar24[0x3c] | !bVar2 * auVar20[0x3c];
        bVar2 = (bool)(bVar9 >> 5 & 1);
        auVar26[0x3d] = bVar2 * auVar24[0x3d] | !bVar2 * auVar20[0x3d];
        bVar2 = (bool)(bVar9 >> 6 & 1);
        auVar26[0x3e] = bVar2 * auVar24[0x3e] | !bVar2 * auVar20[0x3e];
        auVar26[0x3f] = -cVar11 * auVar24[0x3f] | !(bool)-cVar11 * auVar20[0x3f];
        auVar20 = vpsubb_avx512bw(in_ZMM19,auVar27);
        auVar24 = vmovdqu8_avx512bw(auVar27);
        auVar27[0] = (bVar1 & 1) * auVar24[0] | !(bool)(bVar1 & 1) * auVar20[0];
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar27[1] = bVar2 * auVar24[1] | !bVar2 * auVar20[1];
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar27[2] = bVar2 * auVar24[2] | !bVar2 * auVar20[2];
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar27[3] = bVar2 * auVar24[3] | !bVar2 * auVar20[3];
        bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
        auVar27[4] = bVar2 * auVar24[4] | !bVar2 * auVar20[4];
        bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
        auVar27[5] = bVar2 * auVar24[5] | !bVar2 * auVar20[5];
        bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
        auVar27[6] = bVar2 * auVar24[6] | !bVar2 * auVar20[6];
        bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
        auVar27[7] = bVar2 * auVar24[7] | !bVar2 * auVar20[7];
        auVar27[8] = (bVar3 & 1) * auVar24[8] | !(bool)(bVar3 & 1) * auVar20[8];
        bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
        auVar27[9] = bVar2 * auVar24[9] | !bVar2 * auVar20[9];
        bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
        auVar27[10] = bVar2 * auVar24[10] | !bVar2 * auVar20[10];
        bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
        auVar27[0xb] = bVar2 * auVar24[0xb] | !bVar2 * auVar20[0xb];
        bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
        auVar27[0xc] = bVar2 * auVar24[0xc] | !bVar2 * auVar20[0xc];
        bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
        auVar27[0xd] = bVar2 * auVar24[0xd] | !bVar2 * auVar20[0xd];
        bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
        auVar27[0xe] = bVar2 * auVar24[0xe] | !bVar2 * auVar20[0xe];
        bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
        auVar27[0xf] = bVar2 * auVar24[0xf] | !bVar2 * auVar20[0xf];
        auVar27[0x10] = (bVar4 & 1) * auVar24[0x10] | !(bool)(bVar4 & 1) * auVar20[0x10];
        bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
        auVar27[0x11] = bVar2 * auVar24[0x11] | !bVar2 * auVar20[0x11];
        bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
        auVar27[0x12] = bVar2 * auVar24[0x12] | !bVar2 * auVar20[0x12];
        bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
        auVar27[0x13] = bVar2 * auVar24[0x13] | !bVar2 * auVar20[0x13];
        bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
        auVar27[0x14] = bVar2 * auVar24[0x14] | !bVar2 * auVar20[0x14];
        bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
        auVar27[0x15] = bVar2 * auVar24[0x15] | !bVar2 * auVar20[0x15];
        bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
        auVar27[0x16] = bVar2 * auVar24[0x16] | !bVar2 * auVar20[0x16];
        bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
        auVar27[0x17] = bVar2 * auVar24[0x17] | !bVar2 * auVar20[0x17];
        auVar27[0x18] = (bVar5 & 1) * auVar24[0x18] | !(bool)(bVar5 & 1) * auVar20[0x18];
        bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
        auVar27[0x19] = bVar2 * auVar24[0x19] | !bVar2 * auVar20[0x19];
        bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
        auVar27[0x1a] = bVar2 * auVar24[0x1a] | !bVar2 * auVar20[0x1a];
        bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
        auVar27[0x1b] = bVar2 * auVar24[0x1b] | !bVar2 * auVar20[0x1b];
        bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
        auVar27[0x1c] = bVar2 * auVar24[0x1c] | !bVar2 * auVar20[0x1c];
        bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
        auVar27[0x1d] = bVar2 * auVar24[0x1d] | !bVar2 * auVar20[0x1d];
        bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
        auVar27[0x1e] = bVar2 * auVar24[0x1e] | !bVar2 * auVar20[0x1e];
        bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
        auVar27[0x1f] = bVar2 * auVar24[0x1f] | !bVar2 * auVar20[0x1f];
        auVar27[0x20] = (bVar6 & 1) * auVar24[0x20] | !(bool)(bVar6 & 1) * auVar20[0x20];
        bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
        auVar27[0x21] = bVar2 * auVar24[0x21] | !bVar2 * auVar20[0x21];
        bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
        auVar27[0x22] = bVar2 * auVar24[0x22] | !bVar2 * auVar20[0x22];
        bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
        auVar27[0x23] = bVar2 * auVar24[0x23] | !bVar2 * auVar20[0x23];
        bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
        auVar27[0x24] = bVar2 * auVar24[0x24] | !bVar2 * auVar20[0x24];
        bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
        auVar27[0x25] = bVar2 * auVar24[0x25] | !bVar2 * auVar20[0x25];
        bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
        auVar27[0x26] = bVar2 * auVar24[0x26] | !bVar2 * auVar20[0x26];
        bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
        auVar27[0x27] = bVar2 * auVar24[0x27] | !bVar2 * auVar20[0x27];
        auVar27[0x28] = (bVar7 & 1) * auVar24[0x28] | !(bool)(bVar7 & 1) * auVar20[0x28];
        bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
        auVar27[0x29] = bVar2 * auVar24[0x29] | !bVar2 * auVar20[0x29];
        bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
        auVar27[0x2a] = bVar2 * auVar24[0x2a] | !bVar2 * auVar20[0x2a];
        bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
        auVar27[0x2b] = bVar2 * auVar24[0x2b] | !bVar2 * auVar20[0x2b];
        bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
        auVar27[0x2c] = bVar2 * auVar24[0x2c] | !bVar2 * auVar20[0x2c];
        bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
        auVar27[0x2d] = bVar2 * auVar24[0x2d] | !bVar2 * auVar20[0x2d];
        bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
        auVar27[0x2e] = bVar2 * auVar24[0x2e] | !bVar2 * auVar20[0x2e];
        bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
        auVar27[0x2f] = bVar2 * auVar24[0x2f] | !bVar2 * auVar20[0x2f];
        auVar27[0x30] = (bVar8 & 1) * auVar24[0x30] | !(bool)(bVar8 & 1) * auVar20[0x30];
        bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
        auVar27[0x31] = bVar2 * auVar24[0x31] | !bVar2 * auVar20[0x31];
        bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
        auVar27[0x32] = bVar2 * auVar24[0x32] | !bVar2 * auVar20[0x32];
        bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
        auVar27[0x33] = bVar2 * auVar24[0x33] | !bVar2 * auVar20[0x33];
        bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
        auVar27[0x34] = bVar2 * auVar24[0x34] | !bVar2 * auVar20[0x34];
        bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
        auVar27[0x35] = bVar2 * auVar24[0x35] | !bVar2 * auVar20[0x35];
        bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
        auVar27[0x36] = bVar2 * auVar24[0x36] | !bVar2 * auVar20[0x36];
        bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
        auVar27[0x37] = bVar2 * auVar24[0x37] | !bVar2 * auVar20[0x37];
        auVar27[0x38] = (bVar9 & 1) * auVar24[0x38] | !(bool)(bVar9 & 1) * auVar20[0x38];
        bVar2 = (bool)(bVar9 >> 1 & 1);
        auVar27[0x39] = bVar2 * auVar24[0x39] | !bVar2 * auVar20[0x39];
        bVar2 = (bool)(bVar9 >> 2 & 1);
        auVar27[0x3a] = bVar2 * auVar24[0x3a] | !bVar2 * auVar20[0x3a];
        bVar2 = (bool)(bVar9 >> 3 & 1);
        auVar27[0x3b] = bVar2 * auVar24[0x3b] | !bVar2 * auVar20[0x3b];
        bVar2 = (bool)(bVar9 >> 4 & 1);
        auVar27[0x3c] = bVar2 * auVar24[0x3c] | !bVar2 * auVar20[0x3c];
        bVar2 = (bool)(bVar9 >> 5 & 1);
        auVar27[0x3d] = bVar2 * auVar24[0x3d] | !bVar2 * auVar20[0x3d];
        bVar2 = (bool)(bVar9 >> 6 & 1);
        auVar27[0x3e] = bVar2 * auVar24[0x3e] | !bVar2 * auVar20[0x3e];
        auVar27[0x3f] = -cVar11 * auVar24[0x3f] | !(bool)-cVar11 * auVar20[0x3f];
        auVar37 = vpdpbusds_avx512_vnni(auVar37,auVar19,auVar29);
        auVar36 = vpdpbusds_avx512_vnni(auVar36,auVar19,auVar28);
        auVar35 = vpdpbusds_avx512_vnni(auVar35,auVar19,auVar22);
        auVar34 = vpdpbusds_avx512_vnni(auVar34,auVar19,auVar23);
        auVar33 = vpdpbusds_avx512_vnni(auVar33,auVar19,auVar21);
        auVar32 = vpdpbusds_avx512_vnni(auVar32,auVar19,auVar25);
        auVar31 = vpdpbusds_avx512_vnni(auVar31,auVar19,auVar26);
        auVar30 = vpdpbusds_avx512_vnni(auVar30,auVar19,auVar27);
      }
      auVar19 = vpunpckldq_avx512f(auVar37,auVar36);
      auVar37 = vpunpckhdq_avx512f(auVar37,auVar36);
      auVar37 = vpaddd_avx512f(auVar37,auVar19);
      auVar36 = vpunpckldq_avx512f(auVar35,auVar34);
      auVar35 = vpunpckhdq_avx512f(auVar35,auVar34);
      auVar36 = vpaddd_avx512f(auVar35,auVar36);
      auVar35 = vpunpcklqdq_avx512f(auVar37,auVar36);
      auVar37 = vpunpckhqdq_avx512f(auVar37,auVar36);
      auVar37 = vpaddd_avx512f(auVar37,auVar35);
      auVar36 = vpunpckldq_avx512f(auVar33,auVar32);
      auVar35 = vpunpckhdq_avx512f(auVar33,auVar32);
      auVar36 = vpaddd_avx512f(auVar35,auVar36);
      auVar35 = vpunpckldq_avx512f(auVar31,auVar30);
      auVar34 = vpunpckhdq_avx512f(auVar31,auVar30);
      auVar35 = vpaddd_avx512f(auVar34,auVar35);
      auVar34 = vpunpcklqdq_avx512f(auVar36,auVar35);
      auVar36 = vpunpckhqdq_avx512f(auVar36,auVar35);
      auVar36 = vpaddd_avx512f(auVar36,auVar34);
      auVar35 = vmovdqa64_avx512f(auVar37);
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
      auVar35 = vpermt2q_avx512f(auVar35,auVar34,auVar36);
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
      auVar37 = vpermt2q_avx512f(auVar37,auVar34,auVar36);
      auVar37 = vpaddd_avx512f(auVar37,auVar35);
      auVar18 = vextracti64x4_avx512f(auVar37,1);
      local_c0 = (vector_t<CPUType::AVX2,_int>)vpaddd_avx2(auVar37._0_32_,auVar18);
      local_f0.row_idx = (Index)uVar16;
      local_f0.col_idx = uVar17;
      local_f0.rows = A_rows;
      local_f0.cols = B_cols;
      callbacks::
      CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>::Run
                (&local_a0,local_c0,&local_f0);
      uVar15 = (ulong)((int)uVar15 + width);
    }
    uVar13 = (ulong)((int)local_d8 + (width >> 3 & 0xfffffff8));
  }
  return;
}

Assistant:

INTGEMM_AVX512VNNI static void Multiply(const int8_t *A, const int8_t *B, Index A_rows, Index width, Index B_cols, Callback callback) {
    assert(width % sizeof(Register) == 0);
    assert(B_cols % 8 == 0);
    assert(reinterpret_cast<uintptr_t>(A) % sizeof(Register) == 0);
    assert(reinterpret_cast<uintptr_t>(B) % sizeof(Register) == 0);
    auto callback_impl = callbacks::CallbackImpl<CPUType::AVX2, Callback>(callback);
    const Index simd_width = width / sizeof(Register);
    Register zeros = setzero_si<Register>();
    // Go over 8 columns of B at a time.
#pragma omp for
    for (Index B0_colidx = 0; B0_colidx < B_cols; B0_colidx += 8) {
      const Register *B0_col = reinterpret_cast<const Register*>(B) + B0_colidx * simd_width;
      // Process one row of A at a time.  Doesn't seem to be faster to do multiple rows of A at once.
      for (Index A_rowidx = 0; A_rowidx < A_rows; ++A_rowidx) {
        // Iterate over shared (inner) dimension.
        const Register *A_live = reinterpret_cast<const Register *>(A + A_rowidx * width);
        const Register *A_end = A_live + simd_width;
        const Register *B_live = B0_col;
        // TODO: separate first step.
        Register sum0 = zeros, sum1 = zeros, sum2 = zeros, sum3 = zeros, sum4 = zeros, sum5 = zeros, sum6 = zeros, sum7 = zeros;
        for (; A_live != A_end; ++A_live, B_live += 8) {
          Register a = *A_live;
          // Retrieve the conveniently consecutive values of B.
          Register b0 = *B_live;
          Register b1 = *(B_live + 1);
          Register b2 = *(B_live + 2);
          Register b3 = *(B_live + 3);
          Register b4 = *(B_live + 4);
          Register b5 = *(B_live + 5);
          Register b6 = *(B_live + 6);
          Register b7 = *(B_live + 7);
          // Get a mask where a is negative.
          __mmask64 neg_mask = _mm512_test_epi8_mask(a, _mm512_set1_epi8(-128));
          Register a_positive = _mm512_abs_epi8(a);
          // Negate by subtracting from zero with a mask.
          b0 = _mm512_mask_sub_epi8(b0, neg_mask, zeros, b0);
          b1 = _mm512_mask_sub_epi8(b1, neg_mask, zeros, b1);
          b2 = _mm512_mask_sub_epi8(b2, neg_mask, zeros, b2);
          b3 = _mm512_mask_sub_epi8(b3, neg_mask, zeros, b3);
          b4 = _mm512_mask_sub_epi8(b4, neg_mask, zeros, b4);
          b5 = _mm512_mask_sub_epi8(b5, neg_mask, zeros, b5);
          b6 = _mm512_mask_sub_epi8(b6, neg_mask, zeros, b6);
          b7 = _mm512_mask_sub_epi8(b7, neg_mask, zeros, b7);
          VNNI8(sum0, a_positive, b0);
          VNNI8(sum1, a_positive, b1);
          VNNI8(sum2, a_positive, b2);
          VNNI8(sum3, a_positive, b3);
          VNNI8(sum4, a_positive, b4);
          VNNI8(sum5, a_positive, b5);
          VNNI8(sum6, a_positive, b6);
          VNNI8(sum7, a_positive, b7);
        }
        Register pack0123 = Pack0123(sum0, sum1, sum2, sum3);
        Register pack4567 = Pack0123(sum4, sum5, sum6, sum7);
        auto total = PermuteSummer(pack0123, pack4567);
        callback_impl.Run(total, callbacks::OutputBufferInfo(A_rowidx, B0_colidx, A_rows, B_cols));
      }
    }
  }